

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QProcessEnvironmentPrivate>::detach
          (QSharedDataPointer<QProcessEnvironmentPrivate> *this)

{
  QProcessEnvironmentPrivate *pQVar1;
  QProcessEnvironmentPrivate *this_00;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QProcessEnvironmentPrivate *)0x0) {
    if ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 1) {
      return;
    }
    if (pQVar1 != (QProcessEnvironmentPrivate *)0x0) {
      this_00 = (QProcessEnvironmentPrivate *)operator_new(0x20);
      QProcessEnvironmentPrivate::QProcessEnvironmentPrivate(this_00,pQVar1);
      goto LAB_0042c7ef;
    }
  }
  this_00 = (QProcessEnvironmentPrivate *)operator_new(0x20);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  (this_00->vars).d.d.ptr =
       (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
        *)0x0;
  (this_00->nameMap).d = (Data *)0x0;
  (this_00->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
LAB_0042c7ef:
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QProcessEnvironmentPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type_conflict)
         (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int> == 0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QProcessEnvironmentPrivate *)0x0)) {
      QMutex::~QMutex(&pQVar1->nameMapMutex);
      QHash<QString,_QByteArray>::~QHash(&pQVar1->nameMap);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&(pQVar1->vars).d);
      operator_delete(pQVar1,0x20);
    }
  }
  (this->d).ptr = this_00;
  return;
}

Assistant:

Q_INLINE_TEMPLATE void QSharedDataPointer<QProcessEnvironmentPrivate>::detach()
{
    if (d && d->ref.loadRelaxed() == 1)
        return;
    QProcessEnvironmentPrivate *x = (d ? new QProcessEnvironmentPrivate(*d)
                                     : new QProcessEnvironmentPrivate);
    x->ref.ref();
    if (d && !d->ref.deref())
        delete d.get();
    d.reset(x);
}